

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O2

void print_type_segment_info(type_segment sec)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  int j;
  ulong uVar4;
  type_pointer pfVar5;
  
  uVar2 = sec._0_8_ & 0xffffffff;
  if (sec.type_segment_count < 1) {
    uVar2 = 0;
  }
  for (uVar3 = 0; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    pfVar5 = sec.type_segment_addr + uVar3;
    printf("  - type[%d]:",uVar3 & 0xffffffff);
    putchar(0x28);
    for (uVar4 = 0; uVar4 < pfVar5->param_count; uVar4 = uVar4 + 1) {
      if (uVar4 != 0) {
        putchar(0x2c);
      }
      pcVar1 = val_type(pfVar5->param_types[uVar4]);
      printf("%s",pcVar1);
    }
    printf(")->(");
    for (uVar4 = 0; uVar4 < pfVar5->return_count; uVar4 = uVar4 + 1) {
      if (uVar4 != 0) {
        putchar(0x2c);
      }
      pcVar1 = val_type(pfVar5->return_types[uVar4]);
      printf("%s",pcVar1);
    }
    puts(")");
  }
  return;
}

Assistant:

void print_type_segment_info(type_segment sec) {
    type_pointer type_segment_addr;
    for (int i = 0; i < sec.type_segment_count; ++i) {
        type_segment_addr = sec.type_segment_addr + i;
        printf("  - type[%d]:", i);
        printf("(");
        for (int j = 0; j < type_segment_addr->param_count; ++j) {
            if (j)printf(",");
            printf("%s", val_type(*(type_segment_addr->param_types + j)));
        }
        printf(")->(");
        for (int j = 0; j < type_segment_addr->return_count; ++j) {
            if (j)printf(",");
            printf("%s", val_type(*(type_segment_addr->return_types + j)));
        }
        printf(")\n");
    }
}